

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_test.cc
# Opt level: O0

void __thiscall
DSATest_GenerateKeyTooLarge_Test::~DSATest_GenerateKeyTooLarge_Test
          (DSATest_GenerateKeyTooLarge_Test *this)

{
  DSATest_GenerateKeyTooLarge_Test *this_local;
  
  ~DSATest_GenerateKeyTooLarge_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DSATest, GenerateKeyTooLarge) {
  bssl::UniquePtr<DSA> dsa = GetFIPSDSA();
  ASSERT_TRUE(dsa);
  bssl::UniquePtr<BIGNUM> large_p(BN_new());
  ASSERT_TRUE(large_p);
  ASSERT_TRUE(BN_set_bit(large_p.get(), 10001));
  ASSERT_TRUE(BN_set_bit(large_p.get(), 0));
  ASSERT_TRUE(DSA_set0_pqg(dsa.get(), /*p=*/large_p.get(), /*q=*/nullptr,
                           /*g=*/nullptr));
  large_p.release();  // |DSA_set0_pqg| takes ownership on success.

  // Don't generate DSA keys if the group is too large.
  EXPECT_FALSE(DSA_generate_key(dsa.get()));
}